

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWrite.cpp
# Opt level: O3

void __thiscall
stk::FileWrite::FileWrite
          (FileWrite *this,string *fileName,uint nChannels,FILE_TYPE type,StkFormat format)

{
  pointer pcVar1;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  Stk::Stk(&this->super_Stk);
  (this->super_Stk)._vptr_Stk = (_func_int **)&PTR__FileWrite_00115d30;
  this->fd_ = (FILE *)0x0;
  pcVar1 = (fileName->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + fileName->_M_string_length);
  open(this,(char *)local_50,nChannels,type,format);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return;
}

Assistant:

FileWrite::FileWrite( std::string fileName, unsigned int nChannels, FILE_TYPE type, Stk::StkFormat format )
  : fd_( 0 )
{
  this->open( fileName, nChannels, type, format );
}